

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O0

void __thiscall
printable_sbo_cow::swap(printable_sbo_cow *this,handle_base **rhs_handle,buffer *rhs_buffer)

{
  bool bVar1;
  bool bVar2;
  ptrdiff_t pVar3;
  uchar *puVar4;
  handle_base *phVar5;
  ptrdiff_t pVar6;
  ptrdiff_t rhs_offset;
  ptrdiff_t this_offset;
  ptrdiff_t offset_1;
  ptrdiff_t offset;
  bool rhs_heap_allocated;
  bool this_heap_allocated;
  buffer *rhs_buffer_local;
  handle_base **rhs_handle_local;
  printable_sbo_cow *this_local;
  
  bVar1 = heap_allocated(this->handle_,&this->buffer_);
  bVar2 = heap_allocated(*rhs_handle,rhs_buffer);
  if ((bVar1) && (bVar2)) {
    std::swap<printable_sbo_cow::handle_base*>(&this->handle_,rhs_handle);
  }
  else if (bVar1) {
    pVar3 = handle_offset(*rhs_handle,rhs_buffer);
    *rhs_handle = this->handle_;
    *(undefined8 *)(this->buffer_)._M_elems = *(undefined8 *)rhs_buffer->_M_elems;
    *(undefined8 *)((this->buffer_)._M_elems + 8) = *(undefined8 *)(rhs_buffer->_M_elems + 8);
    *(undefined8 *)((this->buffer_)._M_elems + 0x10) = *(undefined8 *)(rhs_buffer->_M_elems + 0x10);
    puVar4 = char_ptr<std::array<unsigned_char,24ul>>(&this->buffer_);
    phVar5 = handle_ptr(puVar4 + pVar3);
    this->handle_ = phVar5;
  }
  else if (bVar2) {
    pVar3 = handle_offset(this->handle_,&this->buffer_);
    this->handle_ = *rhs_handle;
    *(undefined8 *)rhs_buffer->_M_elems = *(undefined8 *)(this->buffer_)._M_elems;
    *(undefined8 *)(rhs_buffer->_M_elems + 8) = *(undefined8 *)((this->buffer_)._M_elems + 8);
    *(undefined8 *)(rhs_buffer->_M_elems + 0x10) = *(undefined8 *)((this->buffer_)._M_elems + 0x10);
    puVar4 = char_ptr<std::array<unsigned_char,24ul>>(rhs_buffer);
    phVar5 = handle_ptr(puVar4 + pVar3);
    *rhs_handle = phVar5;
  }
  else {
    pVar3 = handle_offset(this->handle_,&this->buffer_);
    pVar6 = handle_offset(*rhs_handle,rhs_buffer);
    std::swap<unsigned_char,24ul>(&this->buffer_,rhs_buffer);
    puVar4 = char_ptr<std::array<unsigned_char,24ul>>(&this->buffer_);
    phVar5 = handle_ptr(puVar4 + pVar6);
    this->handle_ = phVar5;
    puVar4 = char_ptr<std::array<unsigned_char,24ul>>(rhs_buffer);
    phVar5 = handle_ptr(puVar4 + pVar3);
    *rhs_handle = phVar5;
  }
  return;
}

Assistant:

void swap (handle_base * & rhs_handle, buffer & rhs_buffer)
    {
        const bool this_heap_allocated = heap_allocated(handle_, buffer_);
        const bool rhs_heap_allocated = heap_allocated(rhs_handle, rhs_buffer);

        if (this_heap_allocated && rhs_heap_allocated) {
            std::swap(handle_, rhs_handle);
        } else if (this_heap_allocated) {
            const std::ptrdiff_t offset = handle_offset(rhs_handle, rhs_buffer);
            rhs_handle = handle_;
            buffer_ = rhs_buffer;
            handle_ = handle_ptr(char_ptr(&buffer_) + offset);
        } else if (rhs_heap_allocated) {
            const std::ptrdiff_t offset = handle_offset(handle_, buffer_);
            handle_ = rhs_handle;
            rhs_buffer = buffer_;
            rhs_handle = handle_ptr(char_ptr(&rhs_buffer) + offset);
        } else {
            const std::ptrdiff_t this_offset =
                handle_offset(handle_, buffer_);
            const std::ptrdiff_t rhs_offset =
                handle_offset(rhs_handle, rhs_buffer);
            std::swap(buffer_, rhs_buffer);
            handle_ = handle_ptr(char_ptr(&buffer_) + rhs_offset);
            rhs_handle = handle_ptr(char_ptr(&rhs_buffer) + this_offset);
        }
    }